

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall c4::yml::Tree::_claim(Tree *this)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  long *in_RDI;
  char msg_3 [32];
  NodeData *child;
  size_t ichild;
  char msg_2 [56];
  char msg_1 [31];
  char msg [36];
  size_t sz;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  char *in_stack_fffffffffffffe38;
  Location *in_stack_fffffffffffffe40;
  Location *this_00;
  long local_180;
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  Location local_148;
  long local_120;
  size_t local_118;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  char *local_f0;
  undefined1 local_e8 [64];
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  char *local_90;
  char local_88 [48];
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  char *local_40;
  undefined1 local_38 [40];
  long local_10;
  
  if ((in_RDI[3] == -1) || (*in_RDI == 0)) {
    local_180 = in_RDI[1] << 1;
    if (local_180 == 0) {
      local_180 = 0x10;
    }
    local_10 = local_180;
    reserve((Tree *)msg_3._16_8_,msg_3._8_8_);
    if (in_RDI[3] == -1) {
      memcpy(local_38,"check failed: (m_free_head != NONE)",0x24);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar1 = (code *)in_RDI[0xb];
      Location::Location(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                         CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                         CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      (*pcVar1)(local_38,0x24,in_RDI[8]);
      in_stack_fffffffffffffe20 = uStack_58;
      in_stack_fffffffffffffe24 = uStack_54;
      in_stack_fffffffffffffe28 = local_50;
      in_stack_fffffffffffffe2c = uStack_4c;
      in_stack_fffffffffffffe30 = uStack_48;
      in_stack_fffffffffffffe34 = uStack_44;
      in_stack_fffffffffffffe38 = local_40;
    }
  }
  if ((ulong)in_RDI[1] <= (ulong)in_RDI[2]) {
    builtin_strncpy(local_88,"check failed: (m_size < m_cap)",0x1f);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = (code *)in_RDI[0xb];
    Location::Location(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    (*pcVar1)(local_88,0x1f,in_RDI[8]);
    in_stack_fffffffffffffe20 = uStack_a8;
    in_stack_fffffffffffffe24 = uStack_a4;
    in_stack_fffffffffffffe28 = local_a0;
    in_stack_fffffffffffffe2c = uStack_9c;
    in_stack_fffffffffffffe30 = uStack_98;
    in_stack_fffffffffffffe34 = uStack_94;
    in_stack_fffffffffffffe38 = local_90;
  }
  if ((ulong)in_RDI[1] <= (ulong)in_RDI[3]) {
    memcpy(local_e8,"check failed: (m_free_head >= 0 && m_free_head < m_cap)",0x38);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = (code *)in_RDI[0xb];
    Location::Location(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    (*pcVar1)(local_e8,0x38,in_RDI[8]);
    in_stack_fffffffffffffe20 = uStack_108;
    in_stack_fffffffffffffe24 = uStack_104;
    in_stack_fffffffffffffe28 = local_100;
    in_stack_fffffffffffffe2c = uStack_fc;
    in_stack_fffffffffffffe30 = uStack_f8;
    in_stack_fffffffffffffe34 = uStack_f4;
    in_stack_fffffffffffffe38 = local_f0;
  }
  local_118 = in_RDI[3];
  local_120 = *in_RDI + local_118 * 0x90;
  in_RDI[2] = in_RDI[2] + 1;
  in_RDI[3] = *(long *)(local_120 + 0x80);
  if ((in_RDI[3] == -1) && (in_RDI[4] = -1, in_RDI[2] != in_RDI[1])) {
    local_148.super_LineCol.offset._0_1_ = 'c';
    local_148.super_LineCol.offset._1_1_ = 'h';
    local_148.super_LineCol.offset._2_1_ = 'e';
    local_148.super_LineCol.offset._3_1_ = 'c';
    local_148.super_LineCol.offset._4_1_ = 'k';
    local_148.super_LineCol.offset._5_1_ = ' ';
    local_148.super_LineCol.offset._6_1_ = 'f';
    local_148.super_LineCol.offset._7_1_ = 'a';
    local_148.super_LineCol.line._0_1_ = 'i';
    local_148.super_LineCol.line._1_1_ = 'l';
    local_148.super_LineCol.line._2_1_ = 'e';
    local_148.super_LineCol.line._3_1_ = 'd';
    local_148.super_LineCol.line._4_1_ = ':';
    local_148.super_LineCol.line._5_1_ = ' ';
    local_148.super_LineCol.line._6_1_ = '(';
    local_148.super_LineCol.line._7_1_ = 'm';
    local_148.super_LineCol.col._0_1_ = '_';
    local_148.super_LineCol.col._1_1_ = 's';
    local_148.super_LineCol.col._2_1_ = 'i';
    local_148.super_LineCol.col._3_1_ = 'z';
    local_148.super_LineCol.col._4_1_ = 'e';
    local_148.super_LineCol.col._5_1_ = ' ';
    local_148.super_LineCol.col._6_1_ = '=';
    local_148.super_LineCol.col._7_1_ = '=';
    local_148.name.str = (char *)0x297061635f6d20;
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = (code *)in_RDI[0xb];
    this_00 = &local_148;
    Location::Location(this_00,in_stack_fffffffffffffe38,
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    (*pcVar1)(this_00,0x20,in_RDI[8]);
    in_stack_fffffffffffffe28 = local_160;
    in_stack_fffffffffffffe2c = uStack_15c;
    in_stack_fffffffffffffe30 = uStack_158;
    in_stack_fffffffffffffe34 = uStack_154;
  }
  _clear((Tree *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
         CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  return local_118;
}

Assistant:

size_t Tree::_claim()
{
    if(m_free_head == NONE || m_buf == nullptr)
    {
        size_t sz = 2 * m_cap;
        sz = sz ? sz : 16;
        reserve(sz);
        _RYML_CB_ASSERT(m_callbacks, m_free_head != NONE);
    }

    _RYML_CB_ASSERT(m_callbacks, m_size < m_cap);
    _RYML_CB_ASSERT(m_callbacks, m_free_head >= 0 && m_free_head < m_cap);

    size_t ichild = m_free_head;
    NodeData *child = m_buf + ichild;

    ++m_size;
    m_free_head = child->m_next_sibling;
    if(m_free_head == NONE)
    {
        m_free_tail = NONE;
        _RYML_CB_ASSERT(m_callbacks, m_size == m_cap);
    }

    _clear(ichild);

    return ichild;
}